

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

NodePtr __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
::divideTree(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *obj,unsigned_long left,unsigned_long right,BoundingBox *bbox)

{
  Node *bbox_00;
  reference pvVar1;
  NodePtr pNVar2;
  reference pvVar3;
  double *pdVar4;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_RCX;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_RDX;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_RSI;
  array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
  *in_R8;
  ElementType EVar5;
  int i_2;
  BoundingBox right_bbox;
  BoundingBox left_bbox;
  DistanceType cutval;
  int cutfeat;
  unsigned_long idx;
  int i_1;
  unsigned_long k;
  int i;
  NodePtr node;
  size_type in_stack_fffffffffffffe88;
  ElementType *__n;
  PooledAllocator *in_stack_fffffffffffffe90;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_stack_fffffffffffffe98;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_stack_fffffffffffffea0;
  double dVar6;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar7;
  unsigned_long *in_stack_ffffffffffffff40;
  unsigned_long in_stack_ffffffffffffff48;
  unsigned_long *in_stack_ffffffffffffff50;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_stack_ffffffffffffff58;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_stack_ffffffffffffff60;
  DistanceType *in_stack_ffffffffffffff70;
  BoundingBox *in_stack_ffffffffffffff78;
  ElementType local_60;
  int local_54;
  int local_44;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *local_40;
  int local_34;
  array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
  *__src;
  
  bbox_00 = PooledAllocator::
            allocate<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,geometrycentral::(anonymous_namespace)::Vector3Adaptor,double>,geometrycentral::(anonymous_namespace)::Vector3Adaptor,3,unsigned_long>,nanoflann::L2_Simple_Adaptor<double,geometrycentral::(anonymous_namespace)::Vector3Adaptor,double>,geometrycentral::(anonymous_namespace)::Vector3Adaptor,3,unsigned_long>::Node>
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (in_RSI->m_leaf_max_size < (ulong)((long)in_RCX - (long)in_RDX)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&in_RSI->vind,0);
    __n = &local_60;
    __src = in_R8;
    middleSplit_(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    (bbox_00->node_type).sub.divfeat = local_54;
    memcpy(&stack0xffffffffffffff70,__src,0x30);
    EVar5 = local_60;
    pvVar1 = std::
             array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
             ::operator[](in_R8,(size_type)__n);
    pvVar1->high = EVar5;
    pNVar2 = divideTree(in_RSI,in_RDX,(unsigned_long)in_RCX,(unsigned_long)__src,
                        (BoundingBox *)bbox_00);
    bbox_00->child1 = pNVar2;
    memcpy(&stack0xffffffffffffff40,__src,0x30);
    pvVar1 = std::
             array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
             ::operator[](in_R8,(size_type)__n);
    pvVar1->low = local_60;
    pNVar2 = divideTree(in_RSI,in_RDX,(unsigned_long)in_RCX,(unsigned_long)__src,
                        (BoundingBox *)bbox_00);
    bbox_00->child2 = pNVar2;
    pvVar1 = std::
             array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
             ::operator[](in_R8,(size_type)__n);
    (bbox_00->node_type).lr.right = (unsigned_long)pvVar1->high;
    pvVar1 = std::
             array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
             ::operator[](in_R8,(size_type)__n);
    (bbox_00->node_type).sub.divhigh = pvVar1->low;
    for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pvVar3 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pdVar4 = std::min<double>(&pvVar1->low,&pvVar3->low);
      dVar6 = *pdVar4;
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pvVar1->low = dVar6;
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pvVar3 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pdVar4 = std::max<double>(&pvVar1->high,&pvVar3->high);
      dVar6 = *pdVar4;
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[](in_R8,(size_type)__n);
      pvVar1->high = dVar6;
    }
  }
  else {
    bbox_00->child2 = (Node *)0x0;
    bbox_00->child1 = (Node *)0x0;
    (bbox_00->node_type).lr.left = (unsigned_long)in_RDX;
    (bbox_00->node_type).lr.right = (unsigned_long)in_RCX;
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&in_RSI->vind,(size_type)in_RDX);
      EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          (size_t)in_stack_fffffffffffffe90,(int)(in_stack_fffffffffffffe88 >> 0x20)
                         );
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                             *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      pvVar1->low = EVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&in_RSI->vind,(size_type)in_RDX);
      EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          (size_t)in_stack_fffffffffffffe90,(int)(in_stack_fffffffffffffe88 >> 0x20)
                         );
      pvVar1 = std::
               array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
               ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                             *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      pvVar1->high = EVar5;
    }
    while (local_40 = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                       *)((long)&(in_RDX->
                                 super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                                 ).vind.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1), local_40 < in_RCX) {
      for (local_44 = 0; in_RDX = local_40, local_44 < 3; local_44 = local_44 + 1) {
        pvVar1 = std::
                 array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                 ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                               *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        dVar6 = pvVar1->low;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&in_RSI->vind,(size_type)local_40);
        EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                            (size_t)in_stack_fffffffffffffe90,
                            (int)(in_stack_fffffffffffffe88 >> 0x20));
        if (EVar5 < dVar6) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&in_RSI->vind,(size_type)local_40);
          EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                              (size_t)in_stack_fffffffffffffe90,
                              (int)(in_stack_fffffffffffffe88 >> 0x20));
          pvVar1 = std::
                   array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                   ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          pvVar1->low = EVar5;
        }
        pvVar1 = std::
                 array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                 ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                               *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        dVar6 = pvVar1->high;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&in_RSI->vind,(size_type)local_40);
        EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                            (size_t)in_stack_fffffffffffffe90,
                            (int)(in_stack_fffffffffffffe88 >> 0x20));
        if (dVar6 < EVar5) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&in_RSI->vind,(size_type)local_40);
          EVar5 = dataset_get(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                              (size_t)in_stack_fffffffffffffe90,
                              (int)(in_stack_fffffffffffffe88 >> 0x20));
          pvVar1 = std::
                   array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                   ::operator[]((array<nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>::Interval,_3UL>
                                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          pvVar1->high = EVar5;
        }
      }
    }
  }
  return bbox_00;
}

Assistant:

NodePtr divideTree(Derived &obj, const IndexType left, const IndexType right,
                     BoundingBox &bbox) {
    NodePtr node = obj.pool.template allocate<Node>(); // allocate memory

    /* If too few exemplars remain, then make this a leaf node. */
    if ((right - left) <= static_cast<IndexType>(obj.m_leaf_max_size)) {
      node->child1 = node->child2 = NULL; /* Mark as leaf node. */
      node->node_type.lr.left = left;
      node->node_type.lr.right = right;

      // compute bounding-box of leaf points
      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = dataset_get(obj, obj.vind[left], i);
        bbox[i].high = dataset_get(obj, obj.vind[left], i);
      }
      for (IndexType k = left + 1; k < right; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
          if (bbox[i].low > dataset_get(obj, obj.vind[k], i))
            bbox[i].low = dataset_get(obj, obj.vind[k], i);
          if (bbox[i].high < dataset_get(obj, obj.vind[k], i))
            bbox[i].high = dataset_get(obj, obj.vind[k], i);
        }
      }
    } else {
      IndexType idx;
      int cutfeat;
      DistanceType cutval;
      middleSplit_(obj, &obj.vind[0] + left, right - left, idx, cutfeat, cutval,
                   bbox);

      node->node_type.sub.divfeat = cutfeat;

      BoundingBox left_bbox(bbox);
      left_bbox[cutfeat].high = cutval;
      node->child1 = divideTree(obj, left, left + idx, left_bbox);

      BoundingBox right_bbox(bbox);
      right_bbox[cutfeat].low = cutval;
      node->child2 = divideTree(obj, left + idx, right, right_bbox);

      node->node_type.sub.divlow = left_bbox[cutfeat].high;
      node->node_type.sub.divhigh = right_bbox[cutfeat].low;

      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = std::min(left_bbox[i].low, right_bbox[i].low);
        bbox[i].high = std::max(left_bbox[i].high, right_bbox[i].high);
      }
    }

    return node;
  }